

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall sznet::TimerQueue::TimerQueue(TimerQueue *this,EventLoop *loop)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header;
  this->m_loop = loop;
  (this->m_timerMinHeap).m_ptrArr = (Timer **)0x0;
  (this->m_timerMinHeap).m_size = 0;
  (this->m_timerMinHeap).m_capacity = 0;
  (this->m_timerMinHeap).m_pCmpFunc = event_greater;
  (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TimerQueue::TimerQueue(net::EventLoop* loop):
	m_loop(loop),
	m_timerMinHeap(event_greater)
{
}